

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O0

deUint32 tcu::bilinearSample<4>(ConstPixelBufferAccess *src,float u,float v)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  deUint8 val;
  int iVar5;
  int iVar6;
  deInt32 x;
  deInt32 x_00;
  int x_01;
  int y;
  deUint32 color;
  deUint32 color_00;
  deUint32 color_01;
  deUint32 color_02;
  float fVar7;
  float fVar8;
  undefined4 local_60;
  float f;
  int c;
  deUint32 dst;
  deUint32 p11;
  deUint32 p01;
  deUint32 p10;
  deUint32 p00;
  float b;
  float a;
  int j1;
  int j0;
  int i1;
  int i0;
  int y1;
  int y0;
  int x1;
  int x0;
  int h;
  int w;
  float v_local;
  float u_local;
  ConstPixelBufferAccess *src_local;
  
  iVar5 = ConstPixelBufferAccess::getWidth(src);
  iVar6 = ConstPixelBufferAccess::getHeight(src);
  x = ::deFloorFloatToInt32(u - 0.5);
  x_00 = ::deFloorFloatToInt32(v - 0.5);
  x_01 = de::clamp<int>(x,0,iVar5 + -1);
  iVar5 = de::clamp<int>(x + 1,0,iVar5 + -1);
  y = de::clamp<int>(x_00,0,iVar6 + -1);
  iVar6 = de::clamp<int>(x_00 + 1,0,iVar6 + -1);
  fVar7 = deFloatFrac(u - 0.5);
  fVar8 = deFloatFrac(v - 0.5);
  color = readUnorm8<4>(src,x_01,y);
  color_00 = readUnorm8<4>(src,iVar5,y);
  color_01 = readUnorm8<4>(src,x_01,iVar6);
  color_02 = readUnorm8<4>(src,iVar5,iVar6);
  f = 0.0;
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
    bVar1 = getChannel(color,local_60);
    bVar2 = getChannel(color_00,local_60);
    bVar3 = getChannel(color_01,local_60);
    bVar4 = getChannel(color_02,local_60);
    val = roundToUint8Sat((float)bVar4 * fVar7 * fVar8 +
                          (float)bVar3 * (1.0 - fVar7) * fVar8 +
                          (float)bVar1 * (1.0 - fVar7) * (1.0 - fVar8) +
                          (float)bVar2 * fVar7 * (1.0 - fVar8));
    f = (float)setChannel((deUint32)f,local_60,val);
  }
  return (deUint32)f;
}

Assistant:

inline deUint32 bilinearSample (const ConstPixelBufferAccess& src, float u, float v)
{
	int w = src.getWidth();
	int h = src.getHeight();

	int x0 = deFloorFloatToInt32(u-0.5f);
	int x1 = x0+1;
	int y0 = deFloorFloatToInt32(v-0.5f);
	int y1 = y0+1;

	int i0 = de::clamp(x0, 0, w-1);
	int i1 = de::clamp(x1, 0, w-1);
	int j0 = de::clamp(y0, 0, h-1);
	int j1 = de::clamp(y1, 0, h-1);

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	deUint32 p00	= readUnorm8<NumChannels>(src, i0, j0);
	deUint32 p10	= readUnorm8<NumChannels>(src, i1, j0);
	deUint32 p01	= readUnorm8<NumChannels>(src, i0, j1);
	deUint32 p11	= readUnorm8<NumChannels>(src, i1, j1);
	deUint32 dst	= 0;

	// Interpolate.
	for (int c = 0; c < NumChannels; c++)
	{
		float f = (getChannel(p00, c)*(1.0f-a)*(1.0f-b)) +
				  (getChannel(p10, c)*(     a)*(1.0f-b)) +
				  (getChannel(p01, c)*(1.0f-a)*(     b)) +
				  (getChannel(p11, c)*(     a)*(     b));
		dst = setChannel(dst, c, roundToUint8Sat(f));
	}

	return dst;
}